

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcomp.c
# Opt level: O0

void objendemt(mcmcxdef *ctx,objnum objn,prpnum prop,uint endofs)

{
  uint uVar1;
  uint i;
  uint uVar2;
  uchar *puVar3;
  mcmcxdef *ctx_00;
  long lVar4;
  int in_ECX;
  ushort in_SI;
  undefined8 *in_RDI;
  uint siz;
  prpdef *p;
  objdef *objptr;
  mcmon in_stack_ffffffffffffffbe;
  undefined8 in_stack_ffffffffffffffc0;
  mcmcxdef *in_stack_ffffffffffffffc8;
  uchar *local_30;
  
  puVar3 = mcmlck(in_stack_ffffffffffffffc8,(mcmon)((ulong)in_stack_ffffffffffffffc0 >> 0x30));
  uVar1 = objgetp(ctx,objn,prop,(dattyp *)objptr);
  if (uVar1 == 0) {
    local_30 = (uchar *)0x0;
  }
  else {
    local_30 = puVar3;
    uVar1 = objgetp(ctx,objn,prop,(dattyp *)objptr);
    local_30 = local_30 + uVar1;
  }
  i = in_ECX - (((int)local_30 + 6) - (int)puVar3);
  oswp2(local_30 + 3,i);
  ctx_00 = (mcmcxdef *)(puVar3 + 8);
  uVar2 = osrp2(puVar3 + 8);
  oswp2(ctx_00,(uVar2 & 0xffff) + i + 6);
  lVar4 = *(long *)(*(long *)*in_RDI +
                   (long)((int)(uint)*(ushort *)
                                      (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                                      (long)(int)(in_SI & 0xff) * 2) >> 8) * 8) +
          (long)(int)(*(ushort *)
                       (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] + (long)(int)(in_SI & 0xff) * 2) &
                     0xff) * 0x20;
  *(ushort *)(lVar4 + 0x14) = *(ushort *)(lVar4 + 0x14) | 1;
  mcmunlck(ctx_00,in_stack_ffffffffffffffbe);
  return;
}

Assistant:

void objendemt(mcmcxdef *ctx, objnum objn, prpnum prop, uint endofs)
{
    objdef *objptr;
    prpdef *p;
    uint    siz;
    
    objptr = (objdef *)mcmlck(ctx, (mcmon)objn);
    p = objofsp(objptr, objgetp(ctx, objn, prop, (dattyp *)0));
    
    siz = endofs - (((uchar *)prpvalp(p)) - ((uchar *)objptr));
    
    prpsetsize(p, siz);
    objsfree(objptr, objfree(objptr) + siz + PRPHDRSIZ);
    
    /* mark the object as changed, and unlock it */
    mcmtch(ctx, (mcmon)objn);
    mcmunlck(ctx, (mcmon)objn);
}